

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
CDBWrapper::CreateObfuscateKey(CDBWrapper *this)

{
  long lVar1;
  Span<unsigned_char> bytes;
  Span<unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  allocator<unsigned_char> *in_stack_ffffffffffffff98;
  Span<unsigned_char> *this_00;
  allocator_type *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  this_00 = in_RDI;
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff98);
  Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
             in_stack_ffffffffffffff98);
  bytes.m_size = (size_t)this_00;
  bytes.m_data = (uchar *)in_RDI;
  GetRandBytes(bytes);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<unsigned char> CDBWrapper::CreateObfuscateKey() const
{
    std::vector<uint8_t> ret(OBFUSCATE_KEY_NUM_BYTES);
    GetRandBytes(ret);
    return ret;
}